

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O1

err_t Stream_Printf(stream *Stream,tchar_t *Msg,...)

{
  char in_AL;
  err_t eVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Arg;
  textwriter p;
  tchar_t s [1024];
  __va_list_tag local_528;
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  textwriter local_450;
  tchar_t local_418 [1032];
  
  if (in_AL != '\0') {
    local_4d8 = in_XMM0_Qa;
    local_4c8 = in_XMM1_Qa;
    local_4b8 = in_XMM2_Qa;
    local_4a8 = in_XMM3_Qa;
    local_498 = in_XMM4_Qa;
    local_488 = in_XMM5_Qa;
    local_478 = in_XMM6_Qa;
    local_468 = in_XMM7_Qa;
  }
  if (Stream == (stream *)0x0) {
    eVar1 = -4;
  }
  else {
    local_450.CC = *(charconv **)(*(Stream->Base).VMT + 0xf0);
    local_528.gp_offset = 0x10;
    local_528.fp_offset = 0x30;
    local_528.overflow_arg_area = &Arg[0].overflow_arg_area;
    local_528.reg_save_area = local_508;
    local_4f8 = in_RDX;
    local_4f0 = in_RCX;
    local_4e8 = in_R8;
    local_4e0 = in_R9;
    local_450.Stream = Stream;
    vstprintf_s(local_418,0x400,Msg,&local_528);
    eVar1 = TextWrite(&local_450,local_418);
  }
  return eVar1;
}

Assistant:

err_t Stream_Printf(stream* Stream, const tchar_t* Msg,...)
{
    tchar_t s[MAXLINE];
    va_list Arg;
    textwriter p;
    if (!Stream)
        return ERR_INVALID_PARAM;
    p.Stream = Stream;
    p.CC = Parser_Context(Stream)->ToUTF8;
    va_start(Arg,Msg);
    vstprintf_s(s,TSIZEOF(s),Msg,Arg);
    va_end(Arg);
    return TextWrite(&p,s);
}